

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void charactersDebug(void *ctx,xmlChar *ch,int len)

{
  int local_4c;
  xmlChar local_48 [4];
  int i;
  char out [40];
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (noout == 0) {
    out._36_4_ = len;
    for (local_4c = 0; local_4c < (int)out._36_4_ && local_4c < 0x1e; local_4c = local_4c + 1) {
      local_48[local_4c] = ch[local_4c];
    }
    local_48[local_4c] = '\0';
    fprintf(_stdout,"SAX.characters(%s, %d)\n",local_48,(ulong)(uint)out._36_4_);
  }
  return;
}

Assistant:

static void
charactersDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *ch, int len)
{
    char out[40];
    int i;

    callbacks++;
    if (noout)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	out[i] = ch[i];
    out[i] = 0;

    fprintf(stdout, "SAX.characters(%s, %d)\n", out, len);
}